

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

size_t __thiscall
booster::locale::impl_icu::number_format<char>::do_parse<int>
          (number_format<char> *this,string_type *str,int *v)

{
  char_type *begin;
  int iVar1;
  size_t sVar2;
  UErrorCode err;
  ParsePosition pp;
  UnicodeString tmp;
  Formattable val;
  code *local_e8;
  undefined8 local_e0;
  icu_std_converter<char,_1> local_d8;
  Formattable local_98 [112];
  
  icu_70::Formattable::Formattable(local_98);
  local_e8 = std::_Rb_tree_increment;
  local_e0 = 0xffffffff00000000;
  icu_std_converter<char,_1>::icu(&local_d8,(char_type *)&this->cvt_,(str->_M_dataplus)._M_p);
  (**(code **)(*(long *)this->icu_fmt_ + 0xa0))(this->icu_fmt_,&local_d8,local_98,&local_e8);
  if ((int)local_e0 != 0) {
    iVar1 = icu_70::Formattable::getLong((UErrorCode *)local_98);
    begin = (str->_M_dataplus)._M_p;
    sVar2 = icu_std_converter<char,_1>::cut
                      (&this->cvt_,(UnicodeString *)&local_d8,begin,begin + str->_M_string_length,
                       (long)(int)local_e0,0,0);
    if (sVar2 != 0) {
      *v = iVar1;
      goto LAB_001846d8;
    }
  }
  sVar2 = 0;
LAB_001846d8:
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_d8);
  icu_70::ParsePosition::~ParsePosition((ParsePosition *)&local_e8);
  icu_70::Formattable::~Formattable(local_98);
  return sVar2;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &v) const
            {
                icu::Formattable val;
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data()+str.size());

                icu_fmt_->parse(tmp,val,pp);

                ValueType tmp_v;

                if(pp.getIndex() == 0 || !get_value(tmp_v,val))
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                v=tmp_v;
                return cut;
            }